

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,double t,vector<bool,_std::allocator<bool>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__x;
  optional<std::vector<bool,_std::allocator<bool>_>_> v;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_88;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_58;
  
  if (dst == (vector<bool,_std::allocator<bool>_> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    if (bVar1) {
      primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_88,&this->_var);
      local_58.contained._16_8_ = local_88.contained._16_8_;
      local_58.contained.data._0_8_ = local_88.contained.data._0_8_;
      local_58.has_value_ = local_88.has_value_;
      if (local_88.has_value_ == true) {
        local_88.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_88.contained._8_4_ = 0;
        local_58.contained._32_8_ = local_88.contained._32_8_;
        local_88.contained._16_8_ = 0;
        local_88.contained._24_4_ = 0;
        local_88.contained._32_8_ = 0;
        nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                  (&local_88);
        __x = nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::value
                        (&local_58);
        std::vector<bool,_std::allocator<bool>_>::operator=(dst,__x);
        nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                  (&local_58);
        return true;
      }
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                (&local_88);
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                (&local_58);
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<std::vector<bool,std::allocator<bool>>>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<std::vector<bool,std::allocator<bool>>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }